

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psstack.c
# Opt level: O0

void cf2_stack_free(CF2_Stack stack)

{
  FT_Memory memory_00;
  FT_Memory memory;
  CF2_Stack stack_local;
  
  if (stack != (CF2_Stack)0x0) {
    memory_00 = stack->memory;
    ft_mem_free(memory_00,stack->buffer);
    stack->buffer = (CF2_StackNumber *)0x0;
    ft_mem_free(memory_00,stack);
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_stack_free( CF2_Stack  stack )
  {
    if ( stack )
    {
      FT_Memory  memory = stack->memory;

      /* free the buffer */
      FT_FREE( stack->buffer );

      /* free the main structure */
      FT_FREE( stack );
    }
  }